

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

PyObject *
pybind11::detail::generic_type::new_instance(PyTypeObject *type,PyObject *param_2,PyObject *param_3)

{
  _func_void_PyObject_ptr_void_ptr *p_Var1;
  internals *piVar2;
  type_info *local_38;
  type_info *local_30;
  type_info *tinfo;
  instance<void,_std::unique_ptr<void,_std::default_delete<void>_>_> *self;
  PyObject *param_2_local;
  PyObject *param_1_local;
  PyTypeObject *type_local;
  
  self = (instance<void,_std::unique_ptr<void,_std::default_delete<void>_>_> *)param_3;
  param_2_local = param_2;
  param_1_local = (PyObject *)type;
  tinfo = (type_info *)PyType_GenericAlloc(type,0);
  local_30 = get_type_info((PyTypeObject *)param_1_local);
  p_Var1 = (_func_void_PyObject_ptr_void_ptr *)operator_new(local_30->type_size);
  tinfo->init_holder = p_Var1;
  *(byte *)&(tinfo->implicit_conversions).
            super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
            ._M_impl.super__Vector_impl_data._M_finish =
       *(byte *)&(tinfo->implicit_conversions).
                 super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                 ._M_impl.super__Vector_impl_data._M_finish & 0xfe | 1;
  *(byte *)&(tinfo->implicit_conversions).
            super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
            ._M_impl.super__Vector_impl_data._M_finish =
       *(byte *)&(tinfo->implicit_conversions).
                 super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                 ._M_impl.super__Vector_impl_data._M_finish & 0xfd;
  piVar2 = get_internals();
  local_38 = tinfo;
  std::
  unordered_multimap<void_const*,void*,std::hash<void_const*>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,void*>>>
  ::emplace<void*&,_object*>
            ((unordered_multimap<void_const*,void*,std::hash<void_const*>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,void*>>>
              *)&piVar2->registered_instances,&tinfo->init_holder,(_object **)&local_38);
  return (PyObject *)tinfo;
}

Assistant:

static PyObject *new_instance(PyTypeObject *type, PyObject *, PyObject *) {
        instance<void> *self = (instance<void> *) PyType_GenericAlloc((PyTypeObject *) type, 0);
        auto tinfo = detail::get_type_info(type);
        self->value = ::operator new(tinfo->type_size);
        self->owned = true;
        self->holder_constructed = false;
        detail::get_internals().registered_instances.emplace(self->value, (PyObject *) self);
        return (PyObject *) self;
    }